

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  byte bVar1;
  MessageLite *pMVar2;
  bool bVar3;
  int iVar4;
  Nonnull<const_char_*> failure_msg;
  Descriptor *pDVar5;
  undefined4 extraout_var;
  anon_union_8_9_fdc4a54a_for_Extension_0 aVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Extension *extension;
  Extension *local_40;
  Label local_34;
  LogMessageFatal local_30;
  
  bVar3 = MaybeNewExtension(this,descriptor->number_,descriptor,&local_40);
  if (bVar3) {
    bVar1 = descriptor->type_;
    local_40->type = bVar1;
    local_30.super_LogMessage.errno_saver_.saved_errno_ =
         *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)bVar1 * 4);
    local_34 = 10;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::CppType,google::protobuf::internal::FieldDescriptorLite::CppType>
                            ((CppType *)&local_30,&local_34,
                             "cpp_type(extension->type) == FieldDescriptor::CPPTYPE_MESSAGE");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      local_40->is_repeated = false;
      local_40->field_0xa = local_40->field_0xa | 1;
      local_40->is_packed = false;
      pDVar5 = FieldDescriptor::message_type(descriptor);
      iVar4 = (*factory->_vptr_MessageFactory[2])(factory,pDVar5);
      local_40->field_0xa = local_40->field_0xa & 0xfb;
      aVar6 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              MessageLite::New((MessageLite *)CONCAT44(extraout_var,iVar4),this->arena_);
      local_40->field_0 = aVar6;
      local_40->field_0xa = local_40->field_0xa & 0xfd;
      return (MessageLite *)(local_40->field_0).int64_t_value;
    }
    iVar4 = 0x8a;
  }
  else {
    local_30.super_LogMessage.errno_saver_.saved_errno_ = (uint)local_40->is_repeated * 2 + 1;
    local_34 = LABEL_OPTIONAL;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::Label,google::protobuf::internal::FieldDescriptorLite::Label>
                            ((Label *)&local_30,&local_34,
                             "(*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL == FieldDescriptor::LABEL_OPTIONAL"
                            );
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      local_30.super_LogMessage.errno_saver_.saved_errno_ =
           *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)local_40->type * 4);
      local_34 = 10;
      failure_msg = absl::lts_20250127::log_internal::
                    Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::CppType,google::protobuf::internal::FieldDescriptorLite::CppType>
                              ((CppType *)&local_30,&local_34,
                               "cpp_type((*extension).type) == FieldDescriptor::CPPTYPE_MESSAGE");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        bVar1 = local_40->field_0xa;
        local_40->field_0xa = bVar1 & 0xfd;
        pMVar2 = (MessageLite *)(local_40->field_0).int64_t_value;
        if ((bVar1 & 4) == 0) {
          return pMVar2;
        }
        pDVar5 = FieldDescriptor::message_type(descriptor);
        iVar4 = (*factory->_vptr_MessageFactory[2])(factory,pDVar5);
        iVar4 = (*pMVar2->_vptr_MessageLite[5])(pMVar2,CONCAT44(extraout_var_00,iVar4),this->arena_)
        ;
        return (MessageLite *)CONCAT44(extraout_var_01,iVar4);
      }
    }
    iVar4 = 0x95;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_heavy.cc"
             ,iVar4,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
}

Assistant:

MessageLite* ExtensionSet::MutableMessage(const FieldDescriptor* descriptor,
                                          MessageFactory* factory) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    ABSL_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->is_packed = false;
    const MessageLite* prototype =
        factory->GetPrototype(descriptor->message_type());
    extension->is_lazy = false;
    extension->ptr.message_value = prototype->New(arena_);
    extension->is_cleared = false;
    return extension->ptr.message_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    extension->is_cleared = false;
    if (extension->is_lazy) {
      return extension->ptr.lazymessage_value->MutableMessage(
          *factory->GetPrototype(descriptor->message_type()), arena_);
    } else {
      return extension->ptr.message_value;
    }
  }
}